

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::deque<double,_ft::allocator<double>_>::~deque(deque<double,_ft::allocator<double>_> *this)

{
  _func_int **pp_Var1;
  pointer pvVar2;
  size_type i;
  ulong uVar3;
  undefined1 local_40 [8];
  iterator it;
  
  dequeIterator<double,_32UL>::dequeIterator((dequeIterator<double,_32UL> *)local_40,&this->m_start)
  ;
  pp_Var1 = (_func_int **)it.m_first;
  pvVar2 = it.m_last;
  while (it._vptr_dequeIterator != (_func_int **)(this->m_finish).m_cur) {
    it._vptr_dequeIterator = it._vptr_dequeIterator + 1;
    if (it._vptr_dequeIterator == pp_Var1) {
      it.m_last = pvVar2 + 1;
      it._vptr_dequeIterator = (_func_int **)pvVar2[1];
      pp_Var1 = it._vptr_dequeIterator + 0x20;
      pvVar2 = it.m_last;
      it.m_cur = (pointer)it._vptr_dequeIterator;
      it.m_first = (pointer)pp_Var1;
    }
  }
  for (uVar3 = 0; uVar3 < this->m_map_size; uVar3 = uVar3 + 1) {
    operator_delete(this->m_map[uVar3]);
  }
  operator_delete(this->m_map);
  return;
}

Assistant:

~deque() {
		chunk_allocator	chunk_alloc;

		for (iterator it = this->m_start; it != this->m_finish; ++it) {
			this->m_alloc.destroy(it.m_cur);
		}
		for (size_type i = 0; i < this->m_map_size; ++i) {
			chunk_alloc.destroy(this->m_map + i);
			this->m_alloc.deallocate(this->m_map[i], this->chunk_size());
		}
		chunk_alloc.deallocate(this->m_map, this->m_map_size);
	}